

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::InvalidInputException::InvalidInputException<int>
          (InvalidInputException *this,string *msg,int params)

{
  undefined8 in_RSI;
  string *in_RDI;
  string local_38 [44];
  
  Exception::ConstructMessage<int>(in_RDI,(int)((ulong)in_RSI >> 0x20));
  duckdb::InvalidInputException::InvalidInputException((InvalidInputException *)in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}